

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_reader.c
# Opt level: O2

int dlep_reader_status(dlep_status *status,char *text,size_t text_length,dlep_session *session,
                      dlep_parser_value *value)

{
  ushort uVar1;
  ushort uVar2;
  uint8_t *puVar3;
  
  if ((value == (dlep_parser_value *)0x0) &&
     (value = dlep_session_get_tlv_value(session,1), value == (dlep_parser_value *)0x0)) {
    return -1;
  }
  puVar3 = (session->parser).tlv_ptr;
  uVar1 = value->index;
  *status = (uint)puVar3[uVar1];
  uVar2 = value->length;
  if (text_length == 0 || (ulong)uVar2 < 2) {
    if (text_length == 0) {
      return 0;
    }
  }
  else {
    puVar3 = puVar3 + (ulong)uVar1 + 1;
    if (text_length < uVar2) {
      memcpy(text,puVar3,text_length - 1);
      text = text + (text_length - 1);
    }
    else {
      memcpy(text,puVar3,(ulong)(uVar2 - 1));
      text = text + ((ulong)value->length - 1);
    }
  }
  *text = '\0';
  return 0;
}

Assistant:

int
dlep_reader_status(enum dlep_status *status, char *text, size_t text_length, struct dlep_session *session,
  struct dlep_parser_value *value) {
  const uint8_t *ptr;

  if (!value) {
    value = dlep_session_get_tlv_value(session, DLEP_STATUS_TLV);
    if (!value) {
      return -1;
    }
  }

  ptr = dlep_session_get_tlv_binary(session, value);
  *status = ptr[0];

  if (value->length > 1 && text_length > 0) {
    /* generate a 0 terminated copy of the text */
    if (text_length >= value->length) {
      memcpy(text, &ptr[1], value->length - 1);
      text[value->length - 1] = 0;
    }
    else {
      memcpy(text, &ptr[1], text_length - 1);
      text[text_length - 1] = 0;
    }
  }
  else if (text_length) {
    *text = 0;
  }
  return 0;
}